

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdef.c
# Opt level: O0

s3pid_t mdef_phone_id(mdef_t *m,s3cipid_t ci,s3cipid_t lc,s3cipid_t rc,word_posn_t wpos)

{
  short lc_00;
  short rc_00;
  ph_lc_t *ppVar1;
  ph_rc_t *ppVar2;
  s3cipid_t newr;
  s3cipid_t newl;
  ph_rc_t *rcptr;
  ph_lc_t *lcptr;
  word_posn_t wpos_local;
  s3cipid_t rc_local;
  s3cipid_t lc_local;
  s3cipid_t ci_local;
  mdef_t *m_local;
  
  if (m == (mdef_t *)0x0) {
    __assert_fail("m",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
                  ,0x12a,
                  "s3pid_t mdef_phone_id(mdef_t *, s3cipid_t, s3cipid_t, s3cipid_t, word_posn_t)");
  }
  if ((ci < 0) || (m->n_ciphone <= (int)ci)) {
    __assert_fail("(ci >= 0) && (ci < m->n_ciphone)",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
                  ,299,
                  "s3pid_t mdef_phone_id(mdef_t *, s3cipid_t, s3cipid_t, s3cipid_t, word_posn_t)");
  }
  if ((lc < 0) || (m->n_ciphone <= (int)lc)) {
    __assert_fail("(lc >= 0) && (lc < m->n_ciphone)",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
                  ,300,
                  "s3pid_t mdef_phone_id(mdef_t *, s3cipid_t, s3cipid_t, s3cipid_t, word_posn_t)");
  }
  if ((-1 < rc) && ((int)rc < m->n_ciphone)) {
    if (WORD_POSN_SINGLE < wpos) {
      __assert_fail("(wpos >= 0) && (wpos < N_WORD_POSN)",
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
                    ,0x12e,
                    "s3pid_t mdef_phone_id(mdef_t *, s3cipid_t, s3cipid_t, s3cipid_t, word_posn_t)")
      ;
    }
    ppVar1 = find_ph_lc(m->wpos_ci_lclist[wpos][(int)ci],lc);
    if ((ppVar1 == (ph_lc_t *)0x0) ||
       (ppVar2 = find_ph_rc(ppVar1->rclist,rc), ppVar2 == (ph_rc_t *)0x0)) {
      if (m->sil < 0) {
        m_local._4_4_ = -1;
      }
      else {
        lc_00 = lc;
        if (m->ciphone[(int)lc].filler != 0) {
          lc_00 = m->sil;
        }
        rc_00 = rc;
        if (m->ciphone[(int)rc].filler != 0) {
          rc_00 = m->sil;
        }
        if ((lc_00 == lc) && (rc_00 == rc)) {
          m_local._4_4_ = -1;
        }
        else {
          m_local._4_4_ = mdef_phone_id(m,ci,lc_00,rc_00,wpos);
        }
      }
    }
    else {
      m_local._4_4_ = ppVar2->pid;
    }
    return m_local._4_4_;
  }
  __assert_fail("(rc >= 0) && (rc < m->n_ciphone)",
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
                ,0x12d,
                "s3pid_t mdef_phone_id(mdef_t *, s3cipid_t, s3cipid_t, s3cipid_t, word_posn_t)");
}

Assistant:

s3pid_t
mdef_phone_id(mdef_t * m,
              s3cipid_t ci, s3cipid_t lc, s3cipid_t rc, word_posn_t wpos)
{
    ph_lc_t *lcptr;
    ph_rc_t *rcptr;
    s3cipid_t newl, newr;

    assert(m);
    assert((ci >= 0) && (ci < m->n_ciphone));
    assert((lc >= 0) && (lc < m->n_ciphone));
    assert((rc >= 0) && (rc < m->n_ciphone));
    assert((wpos >= 0) && (wpos < N_WORD_POSN));

    if (((lcptr =
          find_ph_lc(m->wpos_ci_lclist[wpos][(int) ci], lc)) == NULL)
        || ((rcptr = find_ph_rc(lcptr->rclist, rc)) == NULL)) {
        /* Not found; backoff to silence context if non-silence filler context */
        if (NOT_S3CIPID(m->sil))
            return BAD_S3PID;

        newl = m->ciphone[(int) lc].filler ? m->sil : lc;
        newr = m->ciphone[(int) rc].filler ? m->sil : rc;
        if ((newl == lc) && (newr == rc))
            return BAD_S3PID;

        return (mdef_phone_id(m, ci, newl, newr, wpos));
    }

    return (rcptr->pid);
}